

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

int __thiscall
glcts::GeometryShaderRenderingLinesCase::verify
          (GeometryShaderRenderingLinesCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  float fVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong extraout_RAX;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  TestError *pTVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  MessageBuilder local_8c8;
  float local_748;
  float local_744;
  float rendered_rgba_float [4];
  uchar *rendered_rgba_ubyte;
  int centroid_xy [2];
  float local_720 [2];
  Vector<float,_2> local_718;
  Vector<float,_2> local_710;
  int local_708 [2];
  float local_700 [2];
  Vector<float,_2> local_6f8;
  Vector<float,_2> local_6f0;
  int local_6e8 [2];
  float local_6e0 [2];
  Vector<float,_2> local_6d8;
  Vector<float,_2> local_6d0;
  int local_6c8 [2];
  float local_6c0 [2];
  Vector<float,_2> local_6b8;
  Vector<float,_2> local_6b0;
  Vector<float,_2> local_6a8;
  Vec2 v3;
  Vec2 v2;
  Vec2 v1;
  int iStack_688;
  Vec4 reference_rgba_1;
  Vec2 centroid;
  uint n_edge_2;
  uint local_4ec;
  float local_4e8;
  uint n_channel_1;
  float rendered_rgba_1 [4];
  float reference_rgba [4];
  uchar *read_data_1;
  int local_4b0;
  int cur_y_1;
  int cur_x_1;
  uint n_point;
  float local_4a0 [2];
  Vector<float,_4> local_498;
  Vector<float,_4> local_488;
  Vector<float,_4> local_478;
  Vector<float,_4> local_468;
  Vector<float,_4> local_458;
  Vector<float,_4> local_448;
  Vector<float,_4> local_438;
  uint local_428;
  undefined1 auStack_424 [4];
  uint n_edge_1;
  Vec4 start_color;
  Vec4 end_color;
  int start_y_1;
  int start_x_1;
  int iStack_3f4;
  bool ignore_first_point;
  int dy_1;
  int dx_1;
  uint local_26c;
  float local_268;
  uint n_channel;
  float rendered_rgba [4];
  uchar *read_data;
  int local_240;
  int cur_y;
  int cur_x;
  int n_pixel;
  int n_pixels;
  int dy;
  int dx;
  Vector<float,_4> local_21c;
  Vector<float,_4> local_20c;
  Vector<float,_4> local_1fc;
  Vector<float,_4> local_1ec;
  Vector<float,_4> local_1dc;
  Vector<float,_4> local_1cc;
  tcu local_1bc [8];
  float local_1b4 [2];
  Vector<float,_4> local_1ac;
  Vector<float,_4> local_19c;
  Vector<float,_4> local_18c;
  Vector<float,_4> local_17c;
  Vector<float,_4> local_16c;
  Vector<float,_4> local_15c;
  tcu local_14c [8];
  float local_144 [2];
  Vector<float,_4> local_13c;
  Vector<float,_4> local_12c;
  Vector<float,_4> local_11c;
  Vector<float,_4> local_10c;
  Vector<float,_4> local_fc;
  Vector<float,_4> local_ec;
  tcu local_dc [8];
  float local_d4 [2];
  Vector<float,_4> local_cc;
  Vector<float,_4> local_bc;
  Vector<float,_4> local_ac;
  Vector<float,_4> local_9c;
  Vector<float,_4> local_8c;
  Vector<float,_4> local_7c;
  tcu local_6c [8];
  float local_64 [2];
  float local_5c;
  float local_58;
  int start_y;
  int start_x;
  Vec4 expected_rgba;
  int end_y;
  int end_x;
  uint n_edge;
  uint row_width;
  uint single_rt_width;
  uint single_rt_height;
  uint rt_width;
  uint rt_height;
  float epsilon;
  uchar *data_local;
  uint instance_id_local;
  _draw_call_type drawcall_type_local;
  GeometryShaderRenderingLinesCase *this_local;
  
  data_local._4_4_ = (int)ctx;
  data_local._0_4_ = (uint)sig;
  rt_width = 0x3b800000;
  single_rt_height = 0;
  single_rt_width = 0;
  row_width = 0;
  n_edge = 0;
  _rt_height = siglen;
  _instance_id_local = this;
  if ((data_local._4_4_ == 1) || (data_local._4_4_ == 3)) {
    uVar4 = (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode[5])();
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])(this,(ulong)uVar4,&single_rt_width,&single_rt_height);
  }
  else {
    (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
      _vptr_TestNode[0xd])(this,1,&single_rt_width,&single_rt_height);
  }
  (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[0xd])(this,1,&n_edge,&row_width);
  iVar12 = single_rt_width * 4;
  iVar13 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar13 == 0) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(start_color.m_data + 2));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)auStack_424);
    local_428 = 0;
    uVar6 = extraout_RAX;
    while (end_y = (int)uVar6, local_428 < 4) {
      switch(local_428) {
      case 0:
        iStack_3f4 = 6;
        start_x_1 = 0;
        bVar3 = true;
        end_color.m_data[3] = 1.4013e-45;
        end_color.m_data[2] = (float)((uint)data_local * row_width + 1);
        tcu::Vector<float,_4>::Vector(&local_438,0.0,1.0,0.0,0.0);
        start_color.m_data[2] = local_438.m_data[0];
        start_color.m_data[3] = local_438.m_data[1];
        tcu::Vector<float,_4>::Vector(&local_448,1.0,0.0,0.0,0.0);
        auStack_424 = (undefined1  [4])local_448.m_data[0];
        n_edge_1 = (uint)local_448.m_data[1];
        start_color.m_data[0] = local_448.m_data[2];
        start_color.m_data[1] = local_448.m_data[3];
        break;
      case 1:
        iStack_3f4 = 0;
        start_x_1 = 6;
        bVar3 = false;
        end_color.m_data[3] = (float)(n_edge - 1);
        end_color.m_data[2] = (float)((uint)data_local * row_width + 1);
        tcu::Vector<float,_4>::Vector(&local_458,0.0,0.0,1.0,0.0);
        start_color.m_data[2] = local_458.m_data[0];
        start_color.m_data[3] = local_458.m_data[1];
        tcu::Vector<float,_4>::Vector(&local_468,0.0,1.0,0.0,0.0);
        auStack_424 = (undefined1  [4])local_468.m_data[0];
        n_edge_1 = (uint)local_468.m_data[1];
        start_color.m_data[0] = local_468.m_data[2];
        start_color.m_data[1] = local_468.m_data[3];
        break;
      case 2:
        iStack_3f4 = -6;
        start_x_1 = 0;
        bVar3 = false;
        end_color.m_data[3] = (float)(n_edge - 1);
        end_color.m_data[2] = (float)((row_width - 1) + (uint)data_local * row_width);
        tcu::Vector<float,_4>::Vector(&local_478,0.0,0.0,0.0,1.0);
        start_color.m_data[2] = local_478.m_data[0];
        start_color.m_data[3] = local_478.m_data[1];
        tcu::Vector<float,_4>::Vector(&local_488,0.0,0.0,1.0,0.0);
        auStack_424 = (undefined1  [4])local_488.m_data[0];
        n_edge_1 = (uint)local_488.m_data[1];
        start_color.m_data[0] = local_488.m_data[2];
        start_color.m_data[1] = local_488.m_data[3];
        break;
      case 3:
        iStack_3f4 = 0;
        start_x_1 = -6;
        bVar3 = false;
        end_color.m_data[3] = 1.4013e-45;
        end_color.m_data[2] = (float)((row_width - 1) + (uint)data_local * row_width);
        tcu::Vector<float,_4>::Vector(&local_498,1.0,0.0,0.0,0.0);
        start_color.m_data[2] = local_498.m_data[0];
        start_color.m_data[3] = local_498.m_data[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cur_x_1,0.0,0.0,0.0,1.0);
        auStack_424 = (undefined1  [4])cur_x_1;
        n_edge_1 = n_point;
        start_color.m_data[0] = local_4a0[0];
        start_color.m_data[1] = local_4a0[1];
        break;
      default:
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Unrecognized edge index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xe20);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      for (cur_y_1 = 0; (uint)cur_y_1 < 8; cur_y_1 = cur_y_1 + 1) {
        local_4b0 = (int)end_color.m_data[3] + cur_y_1 * iStack_3f4;
        read_data_1._4_4_ = (int)end_color.m_data[2] + cur_y_1 * start_x_1;
        if ((!bVar3) || (cur_y_1 != 0)) {
          lVar5 = _rt_height + (uint)(read_data_1._4_4_ * iVar12);
          iVar13 = local_4b0 * 4;
          memset(rendered_rgba_1 + 2,0,0x10);
          memset(&local_4e8,0,0x10);
          for (local_4ec = 0; local_4ec < 4; local_4ec = local_4ec + 1) {
            pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)auStack_424,local_4ec);
            fVar15 = *pfVar7;
            pfVar7 = tcu::Vector<float,_4>::operator[]
                               ((Vector<float,_4> *)(start_color.m_data + 2),local_4ec);
            fVar14 = *pfVar7;
            pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)auStack_424,local_4ec);
            rendered_rgba_1[(ulong)local_4ec + 2] =
                 fVar15 + ((fVar14 - *pfVar7) * (float)(uint)cur_y_1) / 7.0;
            (&local_4e8)[local_4ec] = (float)*(byte *)(lVar5 + iVar13 + (ulong)local_4ec) / 255.0;
          }
          fVar15 = de::abs<float>(local_4e8 - rendered_rgba_1[2]);
          if ((((0.00390625 < fVar15) ||
               (fVar15 = de::abs<float>((float)n_channel_1 - rendered_rgba_1[3]),
               0.00390625 < fVar15)) ||
              (fVar15 = de::abs<float>(rendered_rgba_1[0] - reference_rgba[0]), 0.00390625 < fVar15)
              ) || (fVar15 = de::abs<float>(rendered_rgba_1[1] - reference_rgba[1]),
                   0.00390625 < fVar15)) {
            pTVar9 = tcu::TestContext::getLog
                               ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                                super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)(centroid.m_data + 1),pTVar9,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar10 = tcu::MessageBuilder::operator<<
                                ((MessageBuilder *)(centroid.m_data + 1),
                                 (char (*) [19])"Rendered data at (");
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_4b0);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)((long)&read_data_1 + 4));
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2af8606);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_4e8);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(float *)&n_channel_1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_1 + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [64])
                                         "exceeds allowed epsilon when compared to reference data equal ("
                                );
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_1 + 2);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_1 + 3);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,reference_rgba);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,reference_rgba + 1);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2c156ab);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(centroid.m_data + 1));
            pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar11,"Data comparison failed",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                       ,0xe4a);
            __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
      }
      local_428 = local_428 + 1;
      uVar6 = (ulong)local_428;
    }
  }
  else if (iVar13 == 1) {
    for (end_y = 0; (uint)end_y < 4; end_y = end_y + 1) {
      expected_rgba.m_data[3] = 0.0;
      expected_rgba.m_data[2] = 0.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&start_y);
      local_58 = 0.0;
      local_5c = 0.0;
      switch(end_y) {
      case 0:
        local_58 = 4.2039e-45;
        local_5c = (float)((uint)data_local * row_width + 1);
        expected_rgba.m_data[3] = (float)(n_edge - 3);
        expected_rgba.m_data[2] = local_5c;
        tcu::Vector<float,_4>::Vector(&local_8c,1.0,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_9c,0.5);
        tcu::operator*((tcu *)&local_7c,&local_8c,&local_9c);
        tcu::Vector<float,_4>::Vector(&local_bc,0.0,1.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_cc,0.5);
        tcu::operator*((tcu *)&local_ac,&local_bc,&local_cc);
        tcu::operator+(local_6c,&local_7c,&local_ac);
        _start_y = local_6c;
        expected_rgba.m_data[0] = local_64[0];
        expected_rgba.m_data[1] = local_64[1];
        break;
      case 1:
        local_58 = (float)(n_edge - 2);
        local_5c = (float)((uint)data_local * row_width + 3);
        expected_rgba.m_data[2] = (float)((int)local_5c + row_width + -6);
        expected_rgba.m_data[3] = local_58;
        tcu::Vector<float,_4>::Vector(&local_fc,0.0,1.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_10c,0.5);
        tcu::operator*((tcu *)&local_ec,&local_fc,&local_10c);
        tcu::Vector<float,_4>::Vector(&local_12c,0.0,0.0,1.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_13c,0.5);
        tcu::operator*((tcu *)&local_11c,&local_12c,&local_13c);
        tcu::operator+(local_dc,&local_ec,&local_11c);
        _start_y = local_dc;
        expected_rgba.m_data[0] = local_d4[0];
        expected_rgba.m_data[1] = local_d4[1];
        break;
      case 2:
        local_58 = 4.2039e-45;
        local_5c = (float)((row_width - 3) + (uint)data_local * row_width);
        expected_rgba.m_data[3] = (float)(n_edge - 6);
        expected_rgba.m_data[2] = local_5c;
        tcu::Vector<float,_4>::Vector(&local_16c,0.0,0.0,1.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_17c,0.5);
        tcu::operator*((tcu *)&local_15c,&local_16c,&local_17c);
        tcu::Vector<float,_4>::Vector(&local_19c,0.0,0.0,0.0,1.0);
        tcu::Vector<float,_4>::Vector(&local_1ac,0.5);
        tcu::operator*((tcu *)&local_18c,&local_19c,&local_1ac);
        tcu::operator+(local_14c,&local_15c,&local_18c);
        _start_y = local_14c;
        expected_rgba.m_data[0] = local_144[0];
        expected_rgba.m_data[1] = local_144[1];
        break;
      case 3:
        local_58 = 1.4013e-45;
        local_5c = (float)((uint)data_local * row_width + 3);
        expected_rgba.m_data[3] = 1.4013e-45;
        expected_rgba.m_data[2] = (float)((int)local_5c + row_width + -6);
        tcu::Vector<float,_4>::Vector(&local_1dc,0.0,0.0,0.0,1.0);
        tcu::Vector<float,_4>::Vector(&local_1ec,0.5);
        tcu::operator*((tcu *)&local_1cc,&local_1dc,&local_1ec);
        tcu::Vector<float,_4>::Vector(&local_20c,1.0,0.0,0.0,0.0);
        tcu::Vector<float,_4>::Vector(&local_21c,0.5);
        tcu::operator*((tcu *)&local_1fc,&local_20c,&local_21c);
        tcu::operator+(local_1bc,&local_1cc,&local_1fc);
        _start_y = local_1bc;
        expected_rgba.m_data[0] = local_1b4[0];
        expected_rgba.m_data[1] = local_1b4[1];
        break;
      default:
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Unrecognized edge index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xd9f);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      n_pixels = (int)(expected_rgba.m_data[3] != local_58);
      n_pixel = (int)(expected_rgba.m_data[2] != local_5c);
      cur_x = ((int)expected_rgba.m_data[3] - (int)local_58) +
              ((int)expected_rgba.m_data[2] - (int)local_5c);
      for (cur_y = 0; cur_y < cur_x; cur_y = cur_y + 1) {
        local_240 = (int)local_58 + cur_y * n_pixels;
        read_data._4_4_ = (int)local_5c + cur_y * n_pixel;
        lVar5 = _rt_height + (uint)(read_data._4_4_ * iVar12);
        iVar13 = local_240 * 4;
        memset(&local_268,0,0x10);
        for (local_26c = 0; fVar15 = local_268, local_26c < 4; local_26c = local_26c + 1) {
          (&local_268)[local_26c] = (float)*(byte *)(lVar5 + iVar13 + (ulong)local_26c) / 255.0;
        }
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,0);
        fVar15 = de::abs<float>(fVar15 - *pfVar7);
        uVar4 = n_channel;
        if (0.00390625 < fVar15) {
LAB_015c9ee9:
          pTVar9 = tcu::TestContext::getLog
                             ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                              super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)&dy_1,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar10 = tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)&dy_1,(char (*) [19])"Rendered data at (");
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_240);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)((long)&read_data + 4));
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2af8606);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_268);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(float *)&n_channel);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba + 1);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
          pMVar10 = tcu::MessageBuilder::operator<<
                              (pMVar10,(char (*) [64])
                                       "exceeds allowed epsilon when compared to reference data equal ("
                              );
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,0);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,1);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,2);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
          pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,3);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
          pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2c156ab);
          tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&dy_1);
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,"Data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xdc4);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,1);
        fVar14 = de::abs<float>((float)uVar4 - *pfVar7);
        fVar15 = rendered_rgba[0];
        if (0.00390625 < fVar14) goto LAB_015c9ee9;
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,2);
        fVar14 = de::abs<float>(fVar15 - *pfVar7);
        fVar15 = rendered_rgba[1];
        if (0.00390625 < fVar14) goto LAB_015c9ee9;
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)&start_y,3);
        fVar15 = de::abs<float>(fVar15 - *pfVar7);
        if (0.00390625 < fVar15) goto LAB_015c9ee9;
      }
    }
  }
  else {
    if (iVar13 != 2) {
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,"Unsupported shader output type used",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xebb);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (centroid.m_data[0] = 0.0; end_y = (int)centroid.m_data[0], (uint)centroid.m_data[0] < 4;
        centroid.m_data[0] = (float)((int)centroid.m_data[0] + 1)) {
      tcu::Vector<float,_2>::Vector((Vector<float,_2> *)(reference_rgba_1.m_data + 2));
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(v1.m_data + 1));
      tcu::Vector<float,_2>::Vector(&v2);
      tcu::Vector<float,_2>::Vector(&v3);
      tcu::Vector<float,_2>::Vector(&local_6a8,0.5,(float)(uint)data_local + 0.5);
      switch(centroid.m_data[0]) {
      case 0.0:
        tcu::Vector<float,_2>::Vector(&local_6b0,0.0,(float)(uint)data_local + 0.0);
        v2.m_data[0] = local_6b0.m_data[0];
        v2.m_data[1] = local_6b0.m_data[1];
        tcu::Vector<float,_2>::Vector(&local_6b8,1.0,(float)(uint)data_local + 0.0);
        v3.m_data[0] = local_6b8.m_data[0];
        v3.m_data[1] = local_6b8.m_data[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_6c8,1.0,0.0,0.0,0.0);
        v1.m_data[1] = (float)local_6c8[0];
        iStack_688 = local_6c8[1];
        reference_rgba_1.m_data[0] = local_6c0[0];
        reference_rgba_1.m_data[1] = local_6c0[1];
        break;
      case 1.4013e-45:
        tcu::Vector<float,_2>::Vector(&local_6d0,1.0,(float)(uint)data_local + 0.0);
        v2.m_data[0] = local_6d0.m_data[0];
        v2.m_data[1] = local_6d0.m_data[1];
        tcu::Vector<float,_2>::Vector(&local_6d8,1.0,(float)(uint)data_local + 1.0);
        v3.m_data[0] = local_6d8.m_data[0];
        v3.m_data[1] = local_6d8.m_data[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_6e8,0.0,1.0,0.0,0.0);
        v1.m_data[1] = (float)local_6e8[0];
        iStack_688 = local_6e8[1];
        reference_rgba_1.m_data[0] = local_6e0[0];
        reference_rgba_1.m_data[1] = local_6e0[1];
        break;
      case 2.8026e-45:
        tcu::Vector<float,_2>::Vector(&local_6f0,0.0,(float)(uint)data_local + 1.0);
        v2.m_data[0] = local_6f0.m_data[0];
        v2.m_data[1] = local_6f0.m_data[1];
        tcu::Vector<float,_2>::Vector(&local_6f8,1.0,(float)(uint)data_local + 1.0);
        v3.m_data[0] = local_6f8.m_data[0];
        v3.m_data[1] = local_6f8.m_data[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_708,0.0,0.0,1.0,0.0);
        v1.m_data[1] = (float)local_708[0];
        iStack_688 = local_708[1];
        reference_rgba_1.m_data[0] = local_700[0];
        reference_rgba_1.m_data[1] = local_700[1];
        break;
      case 4.2039e-45:
        tcu::Vector<float,_2>::Vector(&local_710,0.0,(float)(uint)data_local + 0.0);
        v2.m_data[0] = local_710.m_data[0];
        v2.m_data[1] = local_710.m_data[1];
        tcu::Vector<float,_2>::Vector(&local_718,0.0,(float)(uint)data_local + 1.0);
        v3.m_data[0] = local_718.m_data[0];
        v3.m_data[1] = local_718.m_data[1];
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)centroid_xy,0.0,0.0,0.0,1.0);
        v1.m_data[1] = (float)centroid_xy[0];
        iStack_688 = centroid_xy[1];
        reference_rgba_1.m_data._0_8_ = local_720;
        break;
      default:
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Unrecognized edge index",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xe92);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pfVar7 = tcu::Vector<float,_2>::operator[](&v2,0);
      fVar15 = *pfVar7;
      pfVar7 = tcu::Vector<float,_2>::operator[](&v3,0);
      fVar14 = *pfVar7;
      pfVar7 = tcu::Vector<float,_2>::operator[](&local_6a8,0);
      fVar1 = *pfVar7;
      pfVar7 = reference_rgba_1.m_data + 2;
      pfVar8 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)pfVar7,0);
      *pfVar8 = (fVar15 + fVar14 + fVar1) / 3.0;
      pfVar8 = tcu::Vector<float,_2>::operator[](&v2,1);
      fVar15 = *pfVar8;
      pfVar8 = tcu::Vector<float,_2>::operator[](&v3,1);
      fVar14 = *pfVar8;
      pfVar8 = tcu::Vector<float,_2>::operator[](&local_6a8,1);
      fVar1 = *pfVar8;
      pfVar8 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)pfVar7,1);
      *pfVar8 = (fVar15 + fVar14 + fVar1) / 3.0;
      pfVar8 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)pfVar7,0);
      rendered_rgba_ubyte._0_4_ = (int)(*pfVar8 * (float)n_edge);
      pfVar7 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)pfVar7,1);
      rendered_rgba_ubyte._4_4_ = (int)(*pfVar7 * (float)row_width);
      rendered_rgba_float._8_8_ =
           _rt_height + (uint)(rendered_rgba_ubyte._4_4_ * iVar12) +
           (long)((int)rendered_rgba_ubyte << 2);
      bVar2 = *(byte *)rendered_rgba_float._8_8_;
      local_744 = (float)*(byte *)(rendered_rgba_float._8_8_ + 1) / 255.0;
      rendered_rgba_float[0] = (float)*(byte *)(rendered_rgba_float._8_8_ + 2) / 255.0;
      rendered_rgba_float[1] = (float)*(byte *)(rendered_rgba_float._8_8_ + 3) / 255.0;
      local_748 = (float)bVar2 / 255.0;
      pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),0);
      fVar14 = de::abs<float>((float)bVar2 / 255.0 - *pfVar7);
      fVar15 = local_744;
      if (0.00390625 < fVar14) {
LAB_015cb340:
        pTVar9 = tcu::TestContext::getLog
                           ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                            super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_8c8,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<(&local_8c8,(char (*) [19])"Rendered data at (");
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)&rendered_rgba_ubyte);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(int *)((long)&rendered_rgba_ubyte + 4));
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [8])0x2af8606);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_748);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_744);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_float);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,rendered_rgba_float + 1);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2b47c71);
        pMVar10 = tcu::MessageBuilder::operator<<
                            (pMVar10,(char (*) [64])
                                     "exceeds allowed epsilon when compared to reference data equal ("
                            );
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),0);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),1);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),2);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2a3caab);
        pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),3);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,pfVar7);
        pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0x2c156ab);
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_8c8);
        pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar11,"Data comparison failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xeb2);
        __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),1);
      fVar14 = de::abs<float>(fVar15 - *pfVar7);
      fVar15 = rendered_rgba_float[0];
      if (0.00390625 < fVar14) goto LAB_015cb340;
      pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),2);
      fVar14 = de::abs<float>(fVar15 - *pfVar7);
      fVar15 = rendered_rgba_float[1];
      if (0.00390625 < fVar14) goto LAB_015cb340;
      pfVar7 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)(v1.m_data + 1),3);
      fVar15 = de::abs<float>(fVar15 - *pfVar7);
      if (0.00390625 < fVar15) goto LAB_015cb340;
    }
  }
  return end_y;
}

Assistant:

void GeometryShaderRenderingLinesCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											  const unsigned char* data)
{
	const float  epsilon		  = 1.0f / 256.0f;
	unsigned int rt_height		  = 0;
	unsigned int rt_width		  = 0;
	unsigned int single_rt_height = 0;
	unsigned int single_rt_width  = 0;

	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Verification is output type-specific */
	const unsigned int row_width = rt_width * 4 /* components */;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		/* The test renders a rectangle outline with 3 line segments for each edge.
		 * The verification checks color of each edge's middle line segment.
		 *
		 * Corners are skipped to keep the implementation simple. */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge;
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			int		  end_x = 0;
			int		  end_y = 0;
			tcu::Vec4 expected_rgba;
			int		  start_x = 0;
			int		  start_y = 0;

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				start_x = 3;								  /* skip the corner */
				start_y = 1 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 3; /* skip the corner */
				end_y = start_y;

				expected_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 1:
			{
				/* Right edge */
				start_x = single_rt_width - 2;				  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				start_x = 3;													 /* skip the corner */
				start_y = single_rt_height - 3 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 6; /* skip the corners */
				end_y = start_y;

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 3:
			{
				/* Left edge */
				start_x = 1;								  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			/* Move over the edge and make sure the rendered pixels are valid */
			int dx		 = (end_x != start_x) ? 1 : 0;
			int dy		 = (end_y != start_y) ? 1 : 0;
			int n_pixels = (end_x - start_x) + (end_y - start_y);

			for (int n_pixel = 0; n_pixel < n_pixels; ++n_pixel)
			{
				int cur_x = start_x + n_pixel * dx;
				int cur_y = start_y + n_pixel * dy;

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		  = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 rendered_rgba[4] = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					rendered_rgba[n_channel] = float(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2]
									   << ", " << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */
			}	 /* for (all points) */
		}		  /* for (all edges) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* Verify centers of the points generated by geometry shader */
		int dx = 0;
		int dy = 0;

		bool ignore_first_point = false;
		int  start_x			= 0;
		int  start_y			= 0;

		tcu::Vec4 end_color;
		tcu::Vec4 start_color;

		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge; NOTE: the test should skip point at (1px, 1px) as it is overwritten by
			 *          edge 3!
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			switch (n_edge)
			{
			case 0:
			{
				dx				   = 6;
				dy				   = 0;
				ignore_first_point = true;
				start_x			   = 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				dx				   = 0;
				dy				   = 6;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				dx				   = -6;
				dy				   = 0;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				dx				   = 0;
				dy				   = -6;
				ignore_first_point = false;
				start_x			   = 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
			{
				int cur_x = start_x + n_point * dx;
				int cur_y = start_y + n_point * dy;

				/* Skip the iteration if we're dealing with a first point, for which
				 * the comparison should be skipped */
				if (ignore_first_point && n_point == 0)
				{
					continue;
				}

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		   = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 reference_rgba[4] = { 0 };
				float				 rendered_rgba[4]  = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					reference_rgba[n_channel] = start_color[n_channel] +
												(end_color[n_channel] - start_color[n_channel]) * float(n_point) / 7.0f;
					rendered_rgba[n_channel] = (float)(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - reference_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - reference_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - reference_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - reference_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
									   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */

			} /* for (all points) */
		}	 /* for (all edges) */

		/* Done */
		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* The test renders four triangles - two vertices are taken from each edge and the third
		 * one is set at (0, 0, 0, 1) (screen-space). The rendering output is verified by
		 * sampling centroids off each triangle */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties */
			tcu::Vec2 centroid;
			tcu::Vec4 reference_rgba;
			tcu::Vec2 v1;
			tcu::Vec2 v2;
			tcu::Vec2 v3 = tcu::Vec2(0.5f, 0.5f + float(instance_id));

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);

				reference_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				/* Right edge */
				v1 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				/* Left edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch (n_edge) */

			/* Calculate centroid of the triangle. */
			centroid[0] = (v1[0] + v2[0] + v3[0]) / 3.0f;
			centroid[1] = (v1[1] + v2[1] + v3[1]) / 3.0f;

			/* Retrieve the sample */
			int centroid_xy[2] = { int(centroid[0] * float(single_rt_width)),
								   int(centroid[1] * float(single_rt_height)) };
			const unsigned char* rendered_rgba_ubyte =
				data + centroid_xy[1] * row_width + centroid_xy[0] * 4 /* components */;
			const float rendered_rgba_float[] = {
				float(rendered_rgba_ubyte[0]) / 255.0f, float(rendered_rgba_ubyte[1]) / 255.0f,
				float(rendered_rgba_ubyte[2]) / 255.0f, float(rendered_rgba_ubyte[3]) / 255.0f,
			};

			/* Compare the reference and rendered pixels */
			if (de::abs(rendered_rgba_float[0] - reference_rgba[0]) > epsilon ||
				de::abs(rendered_rgba_float[1] - reference_rgba[1]) > epsilon ||
				de::abs(rendered_rgba_float[2] - reference_rgba[2]) > epsilon ||
				de::abs(rendered_rgba_float[3] - reference_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << centroid_xy[0] << ", "
								   << centroid_xy[1] << ") "
								   << "equal (" << rendered_rgba_float[0] << ", " << rendered_rgba_float[1] << ", "
								   << rendered_rgba_float[2] << ", " << rendered_rgba_float[3] << ") "
								   << "exceeds allowed epsilon when compared to reference data equal ("
								   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
								   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed");
			} /* if (data comparison failed) */
		}	 /* for (all edges) */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type used");
	}
	} /* switch (m_output_type) */
}